

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

void __thiscall FIX::FileLog::FileLog(FileLog *this,string *path,string *backupPath)

{
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [48];
  string *local_20;
  string *backupPath_local;
  string *path_local;
  FileLog *this_local;
  
  local_20 = backupPath;
  backupPath_local = path;
  path_local = (string *)this;
  Log::Log(&this->super_Log);
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__FileLog_0032f9d0;
  std::ofstream::ofstream(&this->m_messages);
  std::ofstream::ofstream(&this->m_event);
  std::__cxx11::string::string((string *)&this->m_messagesFileName);
  std::__cxx11::string::string((string *)&this->m_eventFileName);
  std::__cxx11::string::string((string *)&this->m_fullPrefix);
  std::__cxx11::string::string((string *)&this->m_fullBackupPrefix);
  std::__cxx11::string::string(local_50,(string *)backupPath_local);
  std::__cxx11::string::string(local_70,(string *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"GLOBAL",&local_91);
  init(this,(EVP_PKEY_CTX *)local_50);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

FileLog::FileLog(const std::string &path, const std::string &backupPath) { init(path, backupPath, "GLOBAL"); }